

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxNodeHeap.h
# Opt level: O0

Gain __thiscall maxNodeHeap::getKey(maxNodeHeap *this,NodeID node)

{
  int iVar1;
  mapped_type *pmVar2;
  reference this_00;
  reference pvVar3;
  NodeID local_14;
  maxNodeHeap *pmStack_10;
  NodeID node_local;
  maxNodeHeap *this_local;
  
  local_14 = node;
  pmStack_10 = this;
  pmVar2 = std::
           unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
           ::operator[](&this->m_element_index,&local_14);
  this_00 = std::vector<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
            ::operator[](&this->m_elements,(long)*pmVar2);
  iVar1 = QElement<maxNodeHeap::Data>::get_index(this_00);
  pvVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     (&this->m_heap,(long)iVar1);
  return pvVar3->first;
}

Assistant:

inline Gain maxNodeHeap::getKey(NodeID node) {
        return m_heap[m_elements[m_element_index[node]].get_index()].first;
}